

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vlookup.cpp
# Opt level: O2

int __thiscall
Vlookup::VertexPool<Vlookup::VertexPosition>::getVertex
          (VertexPool<Vlookup::VertexPosition> *this,VertexPosition *vtx)

{
  iterator iVar1;
  int idx;
  key_type_conflict1 local_24;
  
  DAT_011e4a58 = vtx->mPos[2];
  VertexLess::mFind = *(undefined8 *)vtx->mPos;
  local_24 = -1;
  VertexLess::mList = &this->mVtxs;
  iVar1 = std::_Rb_tree<int,_int,_std::_Identity<int>,_Vlookup::VertexLess,_std::allocator<int>_>::
          find((_Rb_tree<int,_int,_std::_Identity<int>,_Vlookup::VertexLess,_std::allocator<int>_> *
               )this,&local_24);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->mVertSet)._M_t._M_impl.super__Rb_tree_header) {
    _idx = CONCAT44(local_24,(int)(((long)(this->mVtxs).
                                          super__Vector_base<Vlookup::VertexPosition,_std::allocator<Vlookup::VertexPosition>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->mVtxs).
                                         super__Vector_base<Vlookup::VertexPosition,_std::allocator<Vlookup::VertexPosition>_>
                                         ._M_impl.super__Vector_impl_data._M_start) / 0xc));
    std::vector<Vlookup::VertexPosition,_std::allocator<Vlookup::VertexPosition>_>::push_back
              (&this->mVtxs,vtx);
    std::_Rb_tree<int,int,std::_Identity<int>,Vlookup::VertexLess,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,Vlookup::VertexLess,std::allocator<int>> *)this
               ,&idx);
  }
  else {
    idx = iVar1._M_node[1]._M_color;
  }
  return idx;
}

Assistant:

int getVertex(const Type& vtx)
	{
		VertexLess::SetSearch(vtx,&mVtxs);
		VertexSet::iterator found;
		found = mVertSet.find( -1 );
		if ( found != mVertSet.end() )
		{
			return *found;
		}
		int idx = (int)mVtxs.size();
		mVtxs.push_back( vtx );
		mVertSet.insert( idx );
		return idx;
	}